

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

string * __thiscall
cxxopts::values::
abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
get_implicit_value(string *__return_storage_ptr__,
                  abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_implicit_value);
  return __return_storage_ptr__;
}

Assistant:

std::string
      get_implicit_value() const
      {
        return m_implicit_value;
      }